

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_closeslot(lua_State *L,int idx)

{
  StkId pSVar1;
  StkId level;
  int idx_local;
  lua_State *L_local;
  
  pSVar1 = index2stack(L,idx);
  pSVar1 = luaF_close(L,pSVar1,-1,0);
  (pSVar1->val).tt_ = '\0';
  return;
}

Assistant:

LUA_API void lua_closeslot (lua_State *L, int idx) {
  StkId level;
  lua_lock(L);
  level = index2stack(L, idx);
  api_check(L, hastocloseCfunc(L->ci->nresults) && L->tbclist.p == level,
     "no variable to close at given level");
  level = luaF_close(L, level, CLOSEKTOP, 0);
  setnilvalue(s2v(level));
  lua_unlock(L);
}